

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O3

void Wln_ObjSetSlice(Wln_Ntk_t *p,int iObj,int SliceId)

{
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar1;
  
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    if ((p->vTypes).pArray[(uint)iObj] == 0x5b) {
      paVar1 = &p->vFanins[(uint)iObj].field_2;
      if (2 < p->vFanins[(uint)iObj].nSize) {
        paVar1 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar1->pArray[0];
      }
      paVar1->Array[1] = SliceId;
      return;
    }
    __assert_fail("Wln_ObjIsSlice(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                  ,0x48,"void Wln_ObjSetSlice(Wln_Ntk_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_ObjSetSlice( Wln_Ntk_t * p, int iObj, int SliceId )
{
    assert( Wln_ObjIsSlice(p, iObj) );
    Wln_ObjSetFanin( p, iObj, 1, SliceId );
}